

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

int compareFiles(char *r1,char *r2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ssize_t sVar4;
  int local_2040;
  undefined1 local_2038 [8];
  char bytes2 [4096];
  char bytes1 [4096];
  int fd2;
  int fd1;
  int total;
  int res2;
  int res1;
  char *r2_local;
  char *r1_local;
  
  if (update_results == 0) {
    iVar1 = open64(r1,0);
    if (iVar1 < 0) {
      r1_local._4_4_ = 0xffffffff;
    }
    else {
      iVar2 = open64(r2,0);
      do {
        sVar4 = read(iVar1,bytes2 + 0xff8,0x1000);
        iVar3 = (int)sVar4;
        if (iVar2 < 0) {
          local_2040 = 0;
        }
        else {
          sVar4 = read(iVar2,local_2038,0x1000);
          local_2040 = (int)sVar4;
        }
        if ((iVar3 != local_2040) || (iVar3 < 0)) {
          close(iVar1);
          if (-1 < iVar2) {
            close(iVar2);
          }
          return 1;
        }
        if (iVar3 == 0) {
          close(iVar1);
          if (-1 < iVar2) {
            close(iVar2);
          }
          return 0;
        }
        iVar3 = memcmp(bytes2 + 0xff8,local_2038,(long)iVar3);
      } while (iVar3 == 0);
      close(iVar1);
      if (-1 < iVar2) {
        close(iVar2);
      }
      r1_local._4_4_ = 1;
    }
  }
  else {
    iVar1 = open64(r1,0);
    if (iVar1 < 0) {
      r1_local._4_4_ = 0xffffffff;
    }
    else {
      iVar2 = open64(r2,0x241,0x1a4);
      if (iVar2 < 0) {
        close(iVar1);
        r1_local._4_4_ = 0xffffffff;
      }
      else {
        fd2 = 0;
        while( true ) {
          sVar4 = read(iVar1,bytes2 + 0xff8,0x1000);
          iVar3 = (int)sVar4;
          if (iVar3 < 1) break;
          fd2 = iVar3 + fd2;
          sVar4 = write(iVar2,bytes2 + 0xff8,(long)iVar3);
          if (((int)sVar4 < 1) || ((int)sVar4 != iVar3)) break;
        }
        close(iVar2);
        close(iVar1);
        if (fd2 == 0) {
          unlink(r2);
        }
        r1_local._4_4_ = (uint)(iVar3 != 0);
      }
    }
  }
  return r1_local._4_4_;
}

Assistant:

static int compareFiles(const char *r1 /* temp */, const char *r2 /* result */) {
    int res1, res2, total;
    int fd1, fd2;
    char bytes1[4096];
    char bytes2[4096];

    if (update_results) {
        fd1 = open(r1, RD_FLAGS);
        if (fd1 < 0)
            return(-1);
        fd2 = open(r2, WR_FLAGS, 0644);
        if (fd2 < 0) {
            close(fd1);
            return(-1);
        }
        total = 0;
        do {
            res1 = read(fd1, bytes1, 4096);
            if (res1 <= 0)
                break;
            total += res1;
            res2 = write(fd2, bytes1, res1);
            if (res2 <= 0 || res2 != res1)
                break;
        } while (1);
        close(fd2);
        close(fd1);
        if (total == 0)
            unlink(r2);
        return(res1 != 0);
    }

    fd1 = open(r1, RD_FLAGS);
    if (fd1 < 0)
        return(-1);
    fd2 = open(r2, RD_FLAGS);
    while (1) {
        res1 = read(fd1, bytes1, 4096);
        res2 = fd2 >= 0 ? read(fd2, bytes2, 4096) : 0;
	if ((res1 != res2) || (res1 < 0)) {
	    close(fd1);
            if (fd2 >= 0)
                close(fd2);
	    return(1);
	}
	if (res1 == 0)
	    break;
	if (memcmp(bytes1, bytes2, res1) != 0) {
	    close(fd1);
            if (fd2 >= 0)
                close(fd2);
	    return(1);
	}
    }
    close(fd1);
    if (fd2 >= 0)
        close(fd2);
    return(0);
}